

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O2

int njoy::ENDFtk::section::Type<1,_458>::EnergyReleaseComponent::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  char *in_RAX;
  undefined8 *puVar1;
  int args_1;
  
  args_1 = (int)ctx;
  if (args_1 - 3U < 0xfffffffe) {
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
  }
  else {
    args_1 = (int)sig;
    if (0xfffffff6 < args_1 - 10U) {
      return args_1 - 10U;
    }
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*,int>("Found {}",args_1);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void verify( int LDRV, int IFC ) {

  if ( ( LDRV != 1 ) && ( LDRV != 2 ) ) {

    Log::error( "The value for the primary evaluation flag is not recognised" );
    Log::info( "Expected LDRV equal to 1 or 2" );
    Log::info( "Found {}", LDRV );
    throw std::exception();
  }
  if ( ( IFC < 1 ) || ( IFC > 9 ) ) {

    Log::error( "The index for the energy release component is invalid" );
    Log::info( "Expected IFC between 1 and 9" );
    Log::info( "Found {}", IFC );
    throw std::exception();
  }
}